

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_rep(lua_State *L)

{
  undefined1 auVar1 [16];
  char *__src;
  lua_Integer lVar2;
  char *__src_00;
  char *__dest;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  size_t sz;
  size_t l;
  size_t lsep;
  luaL_Buffer b;
  ulong local_2060;
  ulong local_2058;
  luaL_Buffer local_2050;
  
  iVar3 = 1;
  __src = luaL_checklstring(L,1,&local_2060);
  lVar2 = luaL_checkinteger(L,2);
  __src_00 = luaL_optlstring(L,3,"",&local_2058);
  uVar5 = (uint)lVar2;
  if ((int)uVar5 < 1) {
    lua_pushlstring(L,"",0);
  }
  else if ((CARRY8(local_2058,local_2060)) ||
          (uVar4 = CONCAT44(0,uVar5 & 0x7fffffff), auVar1._8_8_ = 0, auVar1._0_8_ = uVar4,
          SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar1,0) <=
          local_2058 + local_2060)) {
    iVar3 = luaL_error(L,"resulting string too large");
  }
  else {
    sz = local_2058 * (uVar5 - 1) + local_2060 * uVar4;
    __dest = luaL_buffinitsize(L,&local_2050,sz);
    if (uVar5 != 1) {
      iVar3 = uVar5 + 1;
      do {
        memcpy(__dest,__src,local_2060);
        __dest = __dest + local_2060;
        if (local_2058 != 0) {
          memcpy(__dest,__src_00,local_2058);
          __dest = __dest + local_2058;
        }
        iVar3 = iVar3 + -1;
      } while (2 < iVar3);
    }
    memcpy(__dest,__src,local_2060);
    luaL_pushresultsize(&local_2050,sz);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int str_rep (lua_State *L) {
  size_t l, lsep;
  const char *s = luaL_checklstring(L, 1, &l);
  int n = luaL_checkint(L, 2);
  const char *sep = luaL_optlstring(L, 3, "", &lsep);
  if (n <= 0) lua_pushliteral(L, "");
  else if (l + lsep < l || l + lsep >= MAXSIZE / n)  /* may overflow? */
    return luaL_error(L, "resulting string too large");
  else {
    size_t totallen = n * l + (n - 1) * lsep;
    luaL_Buffer b;
    char *p = luaL_buffinitsize(L, &b, totallen);
    while (n-- > 1) {  /* first n-1 copies (followed by separator) */
      memcpy(p, s, l * sizeof(char)); p += l;
      if (lsep > 0) {  /* avoid empty 'memcpy' (may be expensive) */
        memcpy(p, sep, lsep * sizeof(char)); p += lsep;
      }
    }
    memcpy(p, s, l * sizeof(char));  /* last copy (not followed by separator) */
    luaL_pushresultsize(&b, totallen);
  }
  return 1;
}